

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O2

void __thiscall CEDate::SetDate(CEDate *this,double *date,CEDateType *time_format)

{
  CEDateType CVar1;
  invalid_value *this_00;
  double dVar2;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  CVar1 = *time_format;
  if (CVar1 == GREGORIAN) {
    dVar2 = Gregorian2JD(*date);
    this->julian_date_ = dVar2;
    dVar2 = Gregorian2MJD(*date);
    this->mod_julian_date_ = dVar2;
    dVar2 = *date;
    this->gregorian_date_ = dVar2;
    Gregorian2GregorianVect((vector<double,_std::allocator<double>_> *)&local_58,dVar2);
  }
  else if (CVar1 == MJD) {
    dVar2 = MJD2JD(*date);
    this->julian_date_ = dVar2;
    dVar2 = *date;
    this->mod_julian_date_ = dVar2;
    dVar2 = MJD2Gregorian(dVar2);
    this->gregorian_date_ = dVar2;
    MJD2GregorianVect((vector<double,_std::allocator<double>_> *)&local_58,*date);
  }
  else {
    if (CVar1 != JD) {
      this_00 = (invalid_value *)__cxa_allocate_exception(0xa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,"CEDate::SetDate()",&local_59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_38,"Invalid date type",&local_5a);
      CEException::invalid_value::invalid_value(this_00,&local_58,&local_38);
      __cxa_throw(this_00,&CEException::invalid_value::typeinfo,
                  CEExceptionHandler::~CEExceptionHandler);
    }
    dVar2 = *date;
    this->julian_date_ = dVar2;
    dVar2 = JD2MJD(dVar2);
    this->mod_julian_date_ = dVar2;
    dVar2 = JD2Gregorian(*date);
    this->gregorian_date_ = dVar2;
    JD2GregorianVect((vector<double,_std::allocator<double>_> *)&local_58,*date);
  }
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->gregorian_date_vect_,(vector<double,_std::allocator<double>_> *)&local_58);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&local_58);
  return;
}

Assistant:

void CEDate::SetDate(const double&     date, 
                     const CEDateType& time_format)
{
    // Fill the internal date storage objects based on the format of the input "date"
    if (time_format == CEDateType::JD) {
        // Save information based on julian date input
        julian_date_ = date ;
        mod_julian_date_ = JD2MJD(date) ;
        gregorian_date_ = JD2Gregorian(date) ;
        gregorian_date_vect_ = JD2GregorianVect(date) ;
    } else if (time_format == CEDateType::MJD) {
        // Save information based on modified julian date input
        julian_date_ = MJD2JD(date) ;
        mod_julian_date_ = date ;
        gregorian_date_ = MJD2Gregorian(date) ;
        gregorian_date_vect_ = MJD2GregorianVect(date) ;
    } else if (time_format == CEDateType::GREGORIAN) {
        // Save information based on gregorian date input
        julian_date_ = Gregorian2JD(date) ;
        mod_julian_date_ = Gregorian2MJD(date) ;
        gregorian_date_ = date ;
        gregorian_date_vect_ = Gregorian2GregorianVect(date) ;
    } else {
        // Date type is invalid
        throw CEException::invalid_value("CEDate::SetDate()", 
                                         "Invalid date type");
    }
}